

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

double alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
       compute_expected_cost
                 (V *values,int num_keys,double density,double expected_insert_frac,
                 LinearModel<int> *existing_model,bool use_sampling,DataNodeStats *stats)

{
  int *piVar1;
  byte in_CL;
  long in_RDX;
  int in_ESI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ExpectedIterationsAndShiftsAccumulator acc_1;
  ExpectedSearchIterationsAccumulator acc;
  double expected_avg_shifts;
  double expected_avg_exp_search_iterations;
  double cost;
  LinearModel<int> model;
  int data_capacity;
  undefined7 in_stack_000000c0;
  int in_stack_ffffffffffffff0c;
  ExpectedIterationsAndShiftsAccumulator *in_stack_ffffffffffffff10;
  StatAccumulator in_stack_ffffffffffffff38;
  StatAccumulator *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  V *in_stack_ffffffffffffff50;
  ExpectedSearchIterationsAccumulator local_90;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 use_sampling_00;
  double dVar5;
  LinearModel<int> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  int num_keys_00;
  V *in_stack_ffffffffffffffa0;
  int local_4c;
  int local_48;
  int local_44;
  double *local_40;
  byte local_31;
  long local_30;
  double local_28;
  int local_14;
  double local_8;
  
  num_keys_00 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  use_sampling_00 = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_31 = in_CL & 1;
  if (local_31 == 0) {
    if (in_ESI == 0) {
      local_8 = 0.0;
    }
    else {
      local_48 = (int)((double)in_ESI / in_XMM0_Qa);
      local_4c = in_ESI + 1;
      local_40 = in_R8;
      local_30 = in_RDX;
      local_28 = in_XMM1_Qa;
      local_14 = in_ESI;
      piVar1 = std::max<int>(&local_48,&local_4c);
      local_44 = *piVar1;
      LinearModel<int>::LinearModel((LinearModel<int> *)&stack0xffffffffffffffa0);
      if (local_30 == 0) {
        build_model(in_stack_ffffffffffffffa0,num_keys_00,in_stack_ffffffffffffff90,
                    (bool)use_sampling_00);
      }
      LinearModel<int>::expand
                ((LinearModel<int> *)&stack0xffffffffffffffa0,(double)local_44 / (double)local_14);
      dVar5 = 0.0;
      if ((local_28 != 0.0) || (NAN(local_28))) {
        ExpectedIterationsAndShiftsAccumulator::ExpectedIterationsAndShiftsAccumulator
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        build_node_implicit(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            (LinearModel<int> *)in_stack_ffffffffffffff38._vptr_StatAccumulator);
        dVar2 = ExpectedIterationsAndShiftsAccumulator::get_expected_num_search_iterations
                          ((ExpectedIterationsAndShiftsAccumulator *)&stack0xffffffffffffff38);
        dVar5 = ExpectedIterationsAndShiftsAccumulator::get_expected_num_shifts
                          ((ExpectedIterationsAndShiftsAccumulator *)&stack0xffffffffffffff38);
        ExpectedIterationsAndShiftsAccumulator::~ExpectedIterationsAndShiftsAccumulator
                  ((ExpectedIterationsAndShiftsAccumulator *)0x13d105);
      }
      else {
        ExpectedSearchIterationsAccumulator::ExpectedSearchIterationsAccumulator
                  ((ExpectedSearchIterationsAccumulator *)in_stack_ffffffffffffff10);
        build_node_implicit(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                            (LinearModel<int> *)in_stack_ffffffffffffff38._vptr_StatAccumulator);
        dVar2 = ExpectedSearchIterationsAccumulator::get_stat(&local_90);
        ExpectedSearchIterationsAccumulator::~ExpectedSearchIterationsAccumulator
                  ((ExpectedSearchIterationsAccumulator *)0x13d057);
      }
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dVar2;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = dVar5 * 0.5 * local_28;
      auVar3 = vfmadd213sd_fma(ZEXT816(0x4034000000000000),auVar3,auVar4);
      local_8 = auVar3._0_8_;
      if (local_40 != (double *)0x0) {
        *local_40 = dVar2;
        local_40[1] = dVar5;
      }
    }
  }
  else {
    local_8 = compute_expected_cost_sampling
                        (values,num_keys,density,expected_insert_frac,existing_model,
                         (DataNodeStats *)CONCAT17(use_sampling,in_stack_000000c0));
  }
  return local_8;
}

Assistant:

static double compute_expected_cost(
      const V* values, int num_keys, double density,
      double expected_insert_frac,
      const LinearModel<T>* existing_model = nullptr, bool use_sampling = false,
      DataNodeStats* stats = nullptr) {
    if (use_sampling) {
      return compute_expected_cost_sampling(values, num_keys, density,
                                            expected_insert_frac,
                                            existing_model, stats);
    }

    if (num_keys == 0) {
      return 0;
    }

    int data_capacity =
        std::max(static_cast<int>(num_keys / density), num_keys + 1);

    // Compute what the node's model would be
    LinearModel<T> model;
    if (existing_model == nullptr) {
      build_model(values, num_keys, &model);
    } else {
      model.a_ = existing_model->a_;
      model.b_ = existing_model->b_;
    }
    model.expand(static_cast<double>(data_capacity) / num_keys);

    // Compute expected stats in order to compute the expected cost
    double cost = 0;
    double expected_avg_exp_search_iterations = 0;
    double expected_avg_shifts = 0;
    if (expected_insert_frac == 0) {
      ExpectedSearchIterationsAccumulator acc;
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations = acc.get_stat();
    } else {
      ExpectedIterationsAndShiftsAccumulator acc(data_capacity);
      build_node_implicit(values, num_keys, data_capacity, &acc, &model);
      expected_avg_exp_search_iterations =
          acc.get_expected_num_search_iterations();
      expected_avg_shifts = acc.get_expected_num_shifts();
    }
    cost = kExpSearchIterationsWeight * expected_avg_exp_search_iterations +
           kShiftsWeight * expected_avg_shifts * expected_insert_frac;

    if (stats) {
      stats->num_search_iterations = expected_avg_exp_search_iterations;
      stats->num_shifts = expected_avg_shifts;
    }

    return cost;
  }